

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::Uniform::setName(Uniform *this,string *parentName,string *_name)

{
  pointer pUVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  ostringstream __name;
  ostringstream childParentName;
  string local_360;
  string local_340;
  ostringstream local_320 [376];
  string local_1a8 [376];
  
  std::__cxx11::string::_M_assign((string *)&this->shortName);
  std::__cxx11::ostringstream::ostringstream(local_320);
  poVar2 = std::operator<<((ostream *)local_320,(string *)parentName);
  std::operator<<(poVar2,(string *)_name);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->name,local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  if ((this->type).baseType == 0) {
    lVar3 = 0;
    for (uVar4 = 0;
        uVar4 < (ulong)(((long)(this->childUniforms).
                               super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->childUniforms).
                              super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x1d8); uVar4 = uVar4 + 1
        ) {
      std::__cxx11::ostringstream::ostringstream(local_320);
      poVar2 = std::operator<<((ostream *)local_320,"m");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::operator<<((ostream *)local_1a8,(string *)&this->name);
      UniformType::streamArrayStr
                (&this->type,(ostringstream *)local_1a8,
                 (int)(uVar4 / (ulong)(long)(this->type).arraySize));
      std::operator<<((ostream *)local_1a8,".");
      pUVar1 = (this->childUniforms).
               super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      setName((Uniform *)((long)&(pUVar1->type).enumType + lVar3),&local_340,&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::__cxx11::ostringstream::~ostringstream(local_320);
      lVar3 = lVar3 + 0x1d8;
    }
  }
  return;
}

Assistant:

void setName(const std::string& parentName, const std::string& _name)
	{
		shortName = _name;
		{
			std::ostringstream __name;
			__name << parentName << _name;
			name = __name.str();
		}
		if (type.isStruct())
		{
			for (size_t i = 0; i < childUniforms.size(); i++)
			{
				std::ostringstream childName;
				childName << "m" << (i % (childUniforms.size() / type.arraySize));
				std::ostringstream childParentName;
				childParentName << name;
				type.streamArrayStr(childParentName, (int)(i / type.arraySize));
				childParentName << ".";
				childUniforms[i].setName(childParentName.str(), childName.str());
			}
		}
	}